

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Creature.cpp
# Opt level: O2

void __thiscall Creature::make_sweet_sweet_love(Creature *this,Creature *mate,size_t xpnt)

{
  pointer psVar1;
  type this_00;
  runtime_error *this_01;
  iterator it;
  pointer this_02;
  pointer psVar2;
  double dVar3;
  
  this_02 = (this->chroms).
            super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->chroms).
           super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = this_02;
  if ((long)psVar1 - (long)this_02 !=
      (long)(mate->chroms).
            super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(mate->chroms).
            super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Mate has wrong number of chromosomes! Sick!");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  for (; this_02 != psVar1; this_02 = this_02 + 1) {
    this_00 = boost::shared_ptr<Chromosome>::operator->(this_02);
    Chromosome::crossover
              (this_00,(shared_ptr<Chromosome> *)
                       (((long)(mate->chroms).
                               super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                               ._M_impl.super__Vector_impl_data._M_start -
                        (long)(this->chroms).
                              super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) + (long)psVar2),xpnt);
    psVar1 = (this->chroms).
             super__Vector_base<boost::shared_ptr<Chromosome>,_std::allocator<boost::shared_ptr<Chromosome>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    psVar2 = psVar2 + 1;
  }
  dVar3 = make_fitness(this);
  this->fitness = dVar3;
  dVar3 = make_fitness(this);
  mate->fitness = dVar3;
  return;
}

Assistant:

void Creature::make_sweet_sweet_love( Creature & mate, size_t xpnt )
{
	if(chroms.size() != mate.chroms.size())
	{
		throw std::runtime_error("Mate has wrong number of chromosomes! Sick!");
	}

	for(chroms_t::iterator it = chroms.begin(); it != chroms.end(); ++it)
	{
		(*it)->crossover(mate.chroms[std::distance(chroms.begin(), it)], xpnt);
	}

	fitness = make_fitness();
	mate.fitness = make_fitness();
}